

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerFlow.cpp
# Opt level: O0

void __thiscall WorkerFlow::WorkerFlow(WorkerFlow *this,string *connect,int port,size_t buffsize)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined8 uVar5;
  string *psVar6;
  int *piVar7;
  size_t local_3d0;
  ulong local_3c0;
  allocator<char> local_39b;
  undefined1 local_39a;
  allocator<char> local_399;
  string local_398 [38];
  undefined1 local_372;
  allocator<char> local_371;
  string local_370 [36];
  int local_34c;
  stringstream local_348 [4];
  int rc;
  stringstream notf_addr;
  ostream local_338 [392];
  stringstream local_1b0 [8];
  stringstream stream_addr;
  ostream local_1a0 [376];
  size_t local_28;
  size_t buffsize_local;
  string *psStack_18;
  int port_local;
  string *connect_local;
  WorkerFlow *this_local;
  
  local_28 = buffsize;
  buffsize_local._4_4_ = port;
  psStack_18 = connect;
  connect_local = (string *)this;
  pvVar2 = (void *)zmq_ctx_new();
  this->m_context = pvVar2;
  pvVar2 = (void *)zmq_socket(this->m_context,7);
  this->m_stream_socket = pvVar2;
  pvVar2 = (void *)zmq_socket(this->m_context,2);
  this->m_notif_socket = pvVar2;
  this->m_cb = (Callback *)0x0;
  this->m_callback_owned = false;
  if (local_28 == 0) {
    local_3c0 = 0x80000;
  }
  else {
    local_3c0 = local_28;
  }
  pcVar3 = (char *)operator_new__(local_3c0);
  this->m_buffer = pcVar3;
  if (local_28 == 0) {
    local_3d0 = 0x80000;
  }
  else {
    local_3d0 = local_28;
  }
  this->m_buffsize = local_3d0;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar4 = std::operator<<(local_1a0,(string *)connect);
  poVar4 = std::operator<<(poVar4,":");
  std::ostream::operator<<(poVar4,buffsize_local._4_4_);
  std::__cxx11::stringstream::stringstream(local_348);
  poVar4 = std::operator<<(local_338,(string *)connect);
  poVar4 = std::operator<<(poVar4,":");
  std::ostream::operator<<(poVar4,buffsize_local._4_4_ + 1);
  pvVar2 = this->m_stream_socket;
  std::__cxx11::stringstream::str();
  uVar5 = std::__cxx11::string::c_str();
  iVar1 = zmq_connect(pvVar2,uVar5);
  std::__cxx11::string::~string(local_370);
  local_34c = iVar1;
  if (iVar1 == -1) {
    local_372 = 1;
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    piVar7 = __errno_location();
    pcVar3 = strerror(*piVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar6,pcVar3,&local_371);
    local_372 = 0;
    __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  pvVar2 = this->m_notif_socket;
  std::__cxx11::stringstream::str();
  uVar5 = std::__cxx11::string::c_str();
  local_34c = zmq_connect(pvVar2,uVar5);
  std::__cxx11::string::~string(local_398);
  if (local_34c == -1) {
    local_39a = 1;
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    piVar7 = __errno_location();
    pcVar3 = strerror(*piVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar6,pcVar3,&local_399);
    local_39a = 0;
    __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  zmq_setsockopt(this->m_notif_socket,6,"",0);
  if (local_34c == -1) {
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    piVar7 = __errno_location();
    pcVar3 = strerror(*piVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar6,pcVar3,&local_39b);
    __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__cxx11::stringstream::~stringstream(local_348);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

WorkerFlow::WorkerFlow(std::string connect, int port, size_t buffsize) : 
    m_context(zmq_ctx_new()),
    m_stream_socket(zmq_socket(m_context, ZMQ_PULL)),
    m_notif_socket(zmq_socket(m_context, ZMQ_SUB)),
    m_cb(NULL),
    m_callback_owned(false),
    m_buffer(new char[(buffsize) ? buffsize : DEFAULT_BUFFER_SIZE]),
    m_buffsize((buffsize) ? buffsize : DEFAULT_BUFFER_SIZE)
{
    // addr
    std::stringstream stream_addr;
    stream_addr << connect << ":" << port;
    std::stringstream notf_addr;
    notf_addr << connect << ":" << (port + 1);
    // connect to the stream endpoint
    int rc = zmq_connect(m_stream_socket, stream_addr.str().c_str());
    if (rc == -1) {
        throw std::string(strerror(errno));
    }
    // connect to to the notification channel endpoint
    rc = zmq_connect(m_notif_socket, notf_addr.str().c_str());
    if (rc == -1) {
        throw std::string(strerror(errno));
    }
    // subscribe to default topic
    zmq_setsockopt(m_notif_socket, ZMQ_SUBSCRIBE, "", 0);
    if (rc == -1) {
        throw std::string(strerror(errno));
    }
}